

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_NtkDfs_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  int iVar1;
  int iVar2;
  int i;
  
  while( true ) {
    iVar1 = Bac_ObjIsBo(p,iObj);
    if (iVar1 == 0) break;
    iObj = Bac_ObjFanin(p,iObj);
  }
  iVar1 = Bac_ObjIsPi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Bac_ObjIsBox(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                    ,0x1c2,"void Bac_NtkDfs_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
    }
  }
  iVar1 = Vec_IntEntry(&p->vCopy,iObj);
  if (0 < iVar1) {
    return;
  }
  Bac_ObjSetCopy(p,iObj,1);
  i = 0;
  iVar1 = iObj;
  while (iVar1 = iVar1 + -1, -1 < iVar1) {
    iVar2 = Bac_ObjIsBi(p,iVar1);
    if (iVar2 == 0) break;
    iVar2 = Bac_BoxFanin(p,iObj,i);
    Bac_NtkDfs_rec(p,iVar2,vBoxes);
    i = i + 1;
  }
  Vec_IntPush(vBoxes,iObj);
  return;
}

Assistant:

void Bac_NtkDfs_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    if ( Bac_ObjIsBo(p, iObj) == 1 )
    {
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
        return;
    }
    assert( Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) > 0 ) // visited
        return;
    Bac_ObjSetCopy( p, iObj, 1 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        Bac_NtkDfs_rec( p, iFanin, vBoxes );
    Vec_IntPush( vBoxes, iObj );
}